

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaopen_string(lua_State *L)

{
  int nrec;
  
  luaL_register(L,"string",strlib);
  lua_createtable(L,1,nrec);
  lua_pushlstring(L,"",0);
  lua_pushvalue(L,-2);
  lua_setmetatable(L,-2);
  L->top = L->top + -1;
  lua_pushvalue(L,-2);
  lua_setfield(L,-2,"__index");
  L->top = L->top + -1;
  return 1;
}

Assistant:

static int luaopen_string(lua_State*L){
luaL_register(L,"string",strlib);
createmetatable(L);
return 1;
}